

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

void __thiscall
kj::_::HeapDisposer<kj::(anonymous_namespace)::PipeReadEnd>::disposeImpl
          (HeapDisposer<kj::(anonymous_namespace)::PipeReadEnd> *this,void *pointer)

{
  bool bVar1;
  anon_class_8_1_8991fb9c_for_func local_28;
  Runnable local_20;
  void *local_18;
  
  if (pointer != (void *)0x0) {
    local_28.this = (PipeReadEnd *)pointer;
    bVar1 = UnwindDetector::isUnwinding((UnwindDetector *)((long)pointer + 0x18));
    if (bVar1) {
      local_20._vptr_Runnable = (_func_int **)&PTR_run_004316a8;
      local_18 = pointer;
      UnwindDetector::catchExceptionsAsSecondaryFaults
                ((UnwindDetector *)((long)pointer + 0x18),&local_20);
    }
    else {
      RunnableImpl<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++:1037:39)>
      ::anon_class_8_1_8991fb9c_for_func::operator()(&local_28);
    }
    Own<kj::(anonymous_namespace)::AsyncPipe>::~Own
              ((Own<kj::(anonymous_namespace)::AsyncPipe> *)((long)pointer + 8));
  }
  operator_delete(pointer,0x20);
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }